

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int buf_grow(buf_t *buf)

{
  uchar *puVar1;
  void *new;
  buf_t *buf_local;
  
  if (buf == (buf_t *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x1b,
                  "int buf_grow(buf_t *)");
  }
  if (buf->size == 0) {
    __assert_fail("buf->size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x1c,
                  "int buf_grow(buf_t *)");
  }
  if (buf->data == (uchar *)0x0) {
    __assert_fail("buf->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x1d,
                  "int buf_grow(buf_t *)");
  }
  if (buf->size < buf->len) {
    __assert_fail("buf->len <= buf->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x1e,
                  "int buf_grow(buf_t *)");
  }
  puVar1 = (uchar *)realloc(buf->data,buf->size << 1);
  if (puVar1 != (uchar *)0x0) {
    buf->data = puVar1;
    buf->size = buf->size << 1;
  }
  buf_local._4_4_ = (uint)(puVar1 != (uchar *)0x0);
  return buf_local._4_4_;
}

Assistant:

int buf_grow(buf_t *buf) {
  assert(buf != NULL);
  assert(buf->size > 0);
  assert(buf->data != NULL);
  assert(buf->len <= buf->size);
  
  void *new = realloc(buf->data, buf->size * 2);
  if (new != NULL) {
    buf->data = new;
    buf->size *= 2;
    return 1;
  } else
    return 0;
}